

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O3

int factors(int M,int *arr)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  int N;
  int iVar8;
  int iVar9;
  
  uVar6 = 0;
  if (M * -0x73ecade3 + 0x26a439fU < 0x4d4873f) {
    uVar6 = 0;
    do {
      M = M / 0x35;
      arr[uVar6] = 0x35;
      uVar6 = uVar6 + 1;
    } while (M * -0x73ecade3 + 0x26a439fU < 0x4d4873f);
  }
  if (M * 0x677d46cf + 0x2b93105U < 0x572620b) {
    piVar5 = arr + (uVar6 & 0xffffffff);
    do {
      M = M / 0x2f;
      *piVar5 = 0x2f;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * 0x677d46cf + 0x2b93105U < 0x572620b);
  }
  if (M * 0x2fa0be83 + 0x2fa0be8U < 0x5f417d1) {
    piVar5 = arr + (uVar6 & 0xffffffff);
    do {
      M = M / 0x2b;
      *piVar5 = 0x2b;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * 0x2fa0be83 + 0x2fa0be8U < 0x5f417d1);
  }
  if (M * -0x3e7063e7 + 0x31f3831U < 0x63e7063) {
    piVar5 = arr + (uVar6 & 0xffffffff);
    do {
      M = M / 0x29;
      *piVar5 = 0x29;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * -0x3e7063e7 + 0x31f3831U < 0x63e7063);
  }
  if (M * -0x6eb3e453 + 0x3759f22U < 0x6eb3e45) {
    piVar5 = arr + (uVar6 & 0xffffffff);
    do {
      M = M / 0x25;
      *piVar5 = 0x25;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * -0x6eb3e453 + 0x3759f22U < 0x6eb3e45);
  }
  if (M * -0x42108421 + 0x4210842U < 0x8421085) {
    piVar5 = arr + (uVar6 & 0xffffffff);
    do {
      M = M / 0x1f;
      *piVar5 = 0x1f;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * -0x42108421 + 0x4210842U < 0x8421085);
  }
  if (M * 0x4f72c235 + 0x469ee58U < 0x8d3dcb1) {
    piVar5 = arr + (int)uVar6;
    do {
      M = M / 0x1d;
      *piVar5 = 0x1d;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * 0x4f72c235 + 0x469ee58U < 0x8d3dcb1);
  }
  if (M * -0x1642c859 + 0x590b216U < 0xb21642d) {
    piVar5 = arr + (int)uVar6;
    do {
      M = M / 0x17;
      *piVar5 = 0x17;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * -0x1642c859 + 0x590b216U < 0xb21642d);
  }
  if (M * 0x286bca1b + 0x6bca1afU < 0xd79435f) {
    piVar5 = arr + (int)uVar6;
    do {
      M = M / 0x13;
      *piVar5 = 0x13;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * 0x286bca1b + 0x6bca1afU < 0xd79435f);
  }
  if (M * -0xf0f0f0f + 0x7878787U < 0xf0f0f0f) {
    piVar5 = arr + (int)uVar6;
    do {
      M = M / 0x11;
      *piVar5 = 0x11;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * -0xf0f0f0f + 0x7878787U < 0xf0f0f0f);
  }
  if (M * -0x3b13b13b + 0x9d89d89U < 0x13b13b13) {
    piVar5 = arr + (int)uVar6;
    do {
      M = M / 0xd;
      *piVar5 = 0xd;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * -0x3b13b13b + 0x9d89d89U < 0x13b13b13);
  }
  if (M * -0x45d1745d + 0xba2e8baU < 0x1745d175) {
    piVar5 = arr + (int)uVar6;
    do {
      M = M / 0xb;
      *piVar5 = 0xb;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (M * -0x45d1745d + 0xba2e8baU < 0x1745d175);
  }
  if ((M & 7U) == 0) {
    piVar5 = arr + (int)uVar6;
    uVar4 = (ulong)(uint)M;
    do {
      uVar3 = (int)uVar4 >> 3;
      uVar4 = (ulong)uVar3;
      *piVar5 = 8;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar1 = M & 0x38;
      M = uVar3;
    } while (uVar1 == 0);
  }
  else {
    uVar4 = (ulong)(uint)M;
  }
  if ((int)uVar4 * -0x49249249 + 0x12492492U < 0x24924925) {
    piVar5 = arr + (int)uVar6;
    do {
      uVar1 = (int)uVar4 / 7;
      uVar4 = (ulong)uVar1;
      *piVar5 = 7;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar1 * -0x49249249 + 0x12492492 < 0x24924925);
  }
  if ((int)uVar4 * -0x33333333 + 0x19999999U < 0x33333333) {
    piVar5 = arr + (int)uVar6;
    do {
      uVar1 = (int)uVar4 / 5;
      uVar4 = (ulong)uVar1;
      *piVar5 = 5;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar1 * -0x33333333 + 0x19999999 < 0x33333333);
  }
  if ((uVar4 & 3) == 0) {
    piVar5 = arr + (int)uVar6;
    uVar7 = uVar4;
    do {
      uVar4 = (ulong)(uint)((int)uVar7 >> 2);
      *piVar5 = 4;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar2 = uVar7 & 0xc;
      uVar7 = uVar4;
    } while (uVar2 == 0);
  }
  if ((int)uVar4 * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
    piVar5 = arr + (int)uVar6;
    do {
      uVar1 = (int)uVar4 / 3;
      uVar4 = (ulong)uVar1;
      *piVar5 = 3;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar1 * -0x55555555 + 0x2aaaaaaa < 0x55555555);
  }
  if ((uVar4 & 1) == 0) {
    piVar5 = arr + (int)uVar6;
    uVar7 = uVar4;
    do {
      uVar4 = (ulong)(uint)((int)uVar7 >> 1);
      *piVar5 = 2;
      piVar5 = piVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar2 = uVar7 & 2;
      uVar7 = uVar4;
    } while (uVar2 == 0);
  }
  iVar9 = (int)uVar6;
  if (0x1f < (int)uVar4) {
    iVar8 = 2;
    do {
      iVar9 = iVar8 * 6 + -1;
      if ((int)uVar4 % iVar9 == 0) {
        piVar5 = arr + (int)uVar6;
        do {
          *piVar5 = iVar9;
          uVar7 = (long)(int)uVar4 / (long)iVar9;
          uVar4 = uVar7 & 0xffffffff;
          piVar5 = piVar5 + 1;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while ((int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) %
                      (long)iVar9) == 0);
      }
      iVar9 = iVar8 * 6 + 1;
      if ((int)uVar4 % iVar9 == 0) {
        piVar5 = arr + (int)uVar6;
        do {
          *piVar5 = iVar9;
          uVar7 = (long)(int)uVar4 / (long)iVar9;
          uVar4 = uVar7 & 0xffffffff;
          piVar5 = piVar5 + 1;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while ((int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) %
                      (long)iVar9) == 0);
      }
      iVar9 = (int)uVar6;
      iVar8 = iVar8 + 1;
    } while (1 < (int)uVar4);
  }
  return iVar9;
}

Assistant:

int factors(int M, int* arr) {
	int i,N,num,mult,m1,m2;
	i = 0;
	N = M;
	while (N%53 == 0) {
		N = N/53;
		arr[i] = 53;
		i++;
	}
	while (N%47 == 0) {
		N = N/47;
		arr[i] = 47;
		i++;
	}
	while (N%43 == 0) {
		N = N/43;
		arr[i] = 43;
		i++;
	}
	while (N%41 == 0) {
		N = N/41;
		arr[i] = 41;
		i++;
	}
	while (N%37 == 0) {
		N = N/37;
		arr[i] = 37;
		i++;
	}
	while (N%31 == 0) {
		N = N/31;
		arr[i] = 31;
		i++;
	}
	while (N%29 == 0) {
		N = N/29;
		arr[i] = 29;
		i++;
	}
	while (N%23 == 0) {
		N = N/23;
		arr[i] = 23;
		i++;
	}
	while (N%19 == 0) {
		N = N/19;
		arr[i] = 19;
		i++;
	}
	while (N%17 == 0) {
		N = N/17;
		arr[i] = 17;
		i++;
	}
	while (N%13 == 0) {
		N = N/13;
		arr[i] = 13;
		i++;
	}
	while (N%11 == 0) {
		N = N/11;
		arr[i] = 11;
		i++;
	}
	while (N%8 == 0) {
		N = N/8;
		arr[i] = 8;
		i++;
	}
	while (N%7 == 0) {
		N = N/7;
		arr[i] = 7;
		i++;
	}
	while (N%5 == 0) {
		N = N/5;
		arr[i] = 5;
		i++;
	}
	while (N%4 == 0) {
		N = N/4;
		arr[i] = 4;
		i++;
	}
	while (N%3 == 0) {
		N = N/3;
		arr[i] = 3;
		i++;
	}
	while (N%2 == 0) {
		N = N/2;
		arr[i] = 2;
		i++;
	}
	if (N > 31) {
		num = 2;

		while (N > 1) {
			mult = num*6;
			m1 = mult-1;
			m2 = mult+1;
			while (N%m1 == 0 ) {
				arr[i] = m1;
				i++;
				N = N / m1;
			}
			while (N%m2 == 0 ) {
				arr[i] = m2;
				i++;
				N = N / m2;
			}
			num+=1;

		}
	}
	return i;

}